

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite_list.hpp
# Opt level: O3

void __thiscall
beast::unit_test::suite_list::insert<jbcoin::tests::ValidatorKeysTool_test>
          (suite_list *this,char *name,char *module,char *library,bool manual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  suite_list *this_00;
  long *plVar2;
  long *plVar3;
  undefined7 in_register_00000081;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar4;
  pair<std::__detail::_Node_iterator<std::type_index,_true,_false>,_bool> pVar5;
  __node_gen_type __node_gen;
  string s;
  allocator local_1d5;
  undefined4 local_1d4;
  char *local_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  char *local_188;
  suite_list *local_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  string local_138;
  string local_118;
  string local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  suite_info local_b8;
  
  paVar1 = &local_b8.name_.field_2;
  local_b8.name_._M_string_length = 0;
  local_b8.name_.field_2._M_local_buf[0] = '\0';
  local_1d0 = name;
  local_188 = library;
  local_b8.name_._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::string((string *)local_d8,library,&local_1d5);
  plVar2 = (long *)::std::__cxx11::string::append((char *)local_d8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_168 = *plVar3;
    lStack_160 = plVar2[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar3;
    local_178 = (long *)*plVar2;
  }
  local_170 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_178);
  local_1c8 = &local_1b8;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1b8 = *plVar3;
    lStack_1b0 = plVar2[3];
  }
  else {
    local_1b8 = *plVar3;
    local_1c8 = (long *)*plVar2;
  }
  local_1c0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_1c8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_198 = *plVar3;
    lStack_190 = plVar2[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar3;
    local_1a8 = (long *)*plVar2;
  }
  local_1a0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_180 = this;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_1a8);
  local_1d4 = (undefined4)CONCAT71(in_register_00000081,manual);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_148 = *plVar3;
    lStack_140 = plVar2[3];
    local_158 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_148;
  }
  else {
    local_148 = *plVar3;
    local_158 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)*plVar2;
  }
  local_150 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_158);
  if (local_158 !=
      (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  this_00 = local_180;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  local_158 = &this_00->names_;
  pVar4 = ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_158,&local_b8);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8.name_._M_dataplus._M_p,
                      CONCAT71(local_b8.name_.field_2._M_allocated_capacity._1_7_,
                               local_b8.name_.field_2._M_local_buf[0]) + 1);
    }
    local_b8.name_._M_dataplus._M_p = (pointer)&this_00->classes_;
    local_158 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jbcoin::tests::ValidatorKeysTool_test::typeinfo;
    pVar5 = ::std::
            _Hashtable<std::type_index,std::type_index,std::allocator<std::type_index>,std::__detail::_Identity,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<std::type_index,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::type_index,false>>>>
                      ();
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      ::std::__cxx11::string::string((string *)&local_f8,local_1d0,(allocator *)&local_158);
      ::std::__cxx11::string::string((string *)&local_118,module,(allocator *)&local_1a8);
      ::std::__cxx11::string::string((string *)&local_138,local_188,(allocator *)&local_1c8);
      make_suite_info<jbcoin::tests::ValidatorKeysTool_test>
                (&local_b8,&local_f8,&local_118,&local_138,local_1d4._0_1_);
      ::std::
      _Rb_tree<beast::unit_test::suite_info,_beast::unit_test::suite_info,_std::_Identity<beast::unit_test::suite_info>,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>
      ::_M_emplace_unique<beast::unit_test::suite_info>
                ((_Rb_tree<beast::unit_test::suite_info,_beast::unit_test::suite_info,_std::_Identity<beast::unit_test::suite_info>,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>
                  *)this_00,&local_b8);
      if (local_b8.run_.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_b8.run_.super__Function_base._M_manager)
                  ((_Any_data *)&local_b8.run_,(_Any_data *)&local_b8.run_,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.library_._M_dataplus._M_p != &local_b8.library_.field_2) {
        operator_delete(local_b8.library_._M_dataplus._M_p,
                        local_b8.library_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.module_._M_dataplus._M_p != &local_b8.module_.field_2) {
        operator_delete(local_b8.module_._M_dataplus._M_p,
                        local_b8.module_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.name_._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8.name_._M_dataplus._M_p,
                        CONCAT71(local_b8.name_.field_2._M_allocated_capacity._1_7_,
                                 local_b8.name_.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    __assert_fail("result.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/beast/extras/beast/unit_test/suite_list.hpp"
                  ,0x42,
                  "void beast::unit_test::suite_list::insert(const char *, const char *, const char *, bool) [Suite = jbcoin::tests::ValidatorKeysTool_test]"
                 );
  }
  __assert_fail("result.second",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/beast/extras/beast/unit_test/suite_list.hpp"
                ,0x3c,
                "void beast::unit_test::suite_list::insert(const char *, const char *, const char *, bool) [Suite = jbcoin::tests::ValidatorKeysTool_test]"
               );
}

Assistant:

void
suite_list::insert(
    char const* name,
    char const* module,
    char const* library,
    bool manual)
{
#ifndef NDEBUG
    {
        std::string s;
        s = std::string(library) + "." + module + "." + name;
        auto const result(names_.insert(s));
        BOOST_ASSERT(result.second); // Duplicate name
    }

    {
        auto const result(classes_.insert(
            std::type_index(typeid(Suite))));
        BOOST_ASSERT(result.second); // Duplicate type
    }
#endif
    cont().emplace(make_suite_info<Suite>(
        name, module, library, manual));
}